

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O0

TopicManagerPtr __thiscall miniros::Publisher::getTopicManager(Publisher *this)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  NodeHandle *in_RSI;
  element_type *in_RDI;
  TopicManagerPtr TVar4;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  this_00 = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x492706);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->node_handle_);
    if (bVar1) {
      std::__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x492722);
      std::__shared_ptr_access<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x49272e);
      TVar4 = NodeHandle::getTopicManager(in_RSI);
      _Var3 = TVar4.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      TopicManager::instance();
      std::shared_ptr<miniros::TopicManager>::shared_ptr
                ((shared_ptr<miniros::TopicManager> *)this_00,
                 (shared_ptr<miniros::TopicManager> *)in_RDI);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  else {
    std::shared_ptr<miniros::TopicManager>::shared_ptr
              ((shared_ptr<miniros::TopicManager> *)this_00,in_RDI);
    _Var3._M_pi = extraout_RDX;
  }
  TVar4.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  TVar4.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (TopicManagerPtr)
         TVar4.super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TopicManagerPtr Publisher::getTopicManager() const {
  if (!impl_)
    return nullptr;
  return impl_->node_handle_? impl_->node_handle_->getTopicManager() : TopicManager::instance();
}